

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

ON_Font * ON_Font::FontFromRichTextProperties
                    (ON_wString *rich_text_font_name,bool bBoldQuartetMember,
                    bool bItalicQuartetMember,bool bUnderlined,bool bStrikethrough)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  ON_FontList *pOVar5;
  wchar_t *pwVar6;
  wchar_t *prefered_face_name;
  ON_Font *pOVar7;
  Weight local_3e1;
  Weight local_3d0;
  Weight local_3ce;
  Weight local_3cd;
  Weight local_3cb;
  ON_Font *local_3c8;
  undefined1 local_2e0 [7];
  bool bInstalledFontIsASubstitute;
  ON_Font *local_2b8;
  ON_Font *installed_substitute;
  ON_Font *managed_fake_font;
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [16];
  ON_wString local_270;
  ON_Font *existing_managed_font;
  undefined1 local_260 [8];
  ON_Font fake_font;
  uint logfont_charset;
  double point_size;
  uint max_weight;
  uint min_weight;
  uint default_bold_unsigned;
  uint default_normal_unsigned;
  uint bold_unsigned;
  uint normal_unsigned;
  undefined1 local_170 [16];
  undefined1 local_160 [16];
  undefined1 local_150 [16];
  ON_Font *names_font;
  ON_Font *bold_weight_font;
  ON_Font *normal_weight_font;
  Weight fake_bold_weight;
  Weight fake_normal_weight;
  ON_wString en_windows_logfont_name;
  ON_wString loc_windows_logfont_name;
  ON_wString en_family_name;
  ON_wString loc_family_name;
  ON_wString en_quartet_name;
  ON_wString loc_quartet_name;
  ON_Font *installed_rtfface;
  ON_Font *local_c0;
  ON_Font *installed_font;
  ON_wString local_str;
  ON_MemoryAllocationTracking disable_tracking;
  ON_Font *managed_quartet_face;
  ON_FontFaceQuartet managed_substitute_quartet;
  ON_Font *installed_font_1;
  ON_FontFaceQuartet installed_quartet;
  Member rich_text_quartet_face;
  undefined1 local_28 [20];
  bool bStrikethrough_local;
  bool bUnderlined_local;
  bool bItalicQuartetMember_local;
  bool bBoldQuartetMember_local;
  ON_wString *rich_text_font_name_local;
  
  local_28[0xc] = bStrikethrough;
  local_28[0xd] = bUnderlined;
  local_28[0xe] = bItalicQuartetMember;
  local_28[0xf] = bBoldQuartetMember;
  unique0x1000112b = rich_text_font_name;
  ON_wString::TrimLeftAndRight(rich_text_font_name,(wchar_t *)0x0);
  bVar1 = ON_wString::IsEmpty(rich_text_font_name);
  if (bVar1) {
    RichTextFontName((ON_Font *)local_28);
    ON_wString::operator=(rich_text_font_name,(ON_wString *)local_28);
    ON_wString::~ON_wString((ON_wString *)local_28);
  }
  installed_quartet.m_bold_italic._3_1_ =
       ON_FontFaceQuartet::MemberFromBoldAndItalic
                 ((bool)(local_28[0xf] & 1),(bool)(local_28[0xe] & 1));
  pOVar5 = ON_ManagedFonts::InstalledFonts();
  pwVar6 = ON_wString::operator_cast_to_wchar_t_(rich_text_font_name);
  ON_FontList::QuartetFromQuartetName((ON_FontFaceQuartet *)&installed_font_1,pOVar5,pwVar6);
  bVar1 = ON_FontFaceQuartet::IsNotEmpty((ON_FontFaceQuartet *)&installed_font_1);
  if ((bVar1) &&
     (pOVar7 = ON_FontFaceQuartet::ClosestFace
                         ((ON_FontFaceQuartet *)&installed_font_1,
                          installed_quartet.m_bold_italic._3_1_), pOVar7 != (ON_Font *)0x0)) {
    rich_text_font_name_local =
         (ON_wString *)
         Internal_DecoratedFont(pOVar7,(bool)(local_28[0xd] & 1),(bool)(local_28[0xc] & 1));
    managed_substitute_quartet.m_bold_italic._4_4_ = 1;
  }
  else {
    pOVar5 = ON_ManagedFonts::ManagedFonts();
    pwVar6 = ON_wString::operator_cast_to_wchar_t_(rich_text_font_name);
    ON_FontList::QuartetFromQuartetName((ON_FontFaceQuartet *)&managed_quartet_face,pOVar5,pwVar6);
    bVar1 = ON_FontFaceQuartet::IsNotEmpty((ON_FontFaceQuartet *)&managed_quartet_face);
    if ((bVar1) &&
       (pOVar7 = ON_FontFaceQuartet::Face
                           ((ON_FontFaceQuartet *)&managed_quartet_face,
                            installed_quartet.m_bold_italic._3_1_), pOVar7 != (ON_Font *)0x0)) {
      rich_text_font_name_local =
           (ON_wString *)
           Internal_DecoratedFont(pOVar7,(bool)(local_28[0xd] & 1),(bool)(local_28[0xc] & 1));
      managed_substitute_quartet.m_bold_italic._4_4_ = 1;
    }
    else {
      ON_MemoryAllocationTracking::ON_MemoryAllocationTracking
                ((ON_MemoryAllocationTracking *)&local_str,false);
      ON_wString::ON_wString((ON_wString *)&stack0xffffffffffffff50,rich_text_font_name);
      ON_wString::operator=(rich_text_font_name,&ON_wString::EmptyString);
      pwVar6 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&stack0xffffffffffffff50);
      ON_wString::ON_wString((ON_wString *)&installed_font,pwVar6);
      ON_wString::operator=(rich_text_font_name,(ON_wString *)&installed_font);
      ON_wString::~ON_wString((ON_wString *)&installed_font);
      ON_wString::~ON_wString((ON_wString *)&stack0xffffffffffffff50);
      local_c0 = (ON_Font *)0x0;
      pwVar6 = ON_wString::operator_cast_to_wchar_t_(rich_text_font_name);
      local_c0 = InstalledFontFromRichTextProperties
                           (pwVar6,(bool)(local_28[0xf] & 1),(bool)(local_28[0xe] & 1));
      if (local_c0 == (ON_Font *)0x0) {
        pOVar5 = InstalledFontList();
        pwVar6 = ON_wString::operator_cast_to_wchar_t_(rich_text_font_name);
        local_c0 = ON_FontList::FromWindowsLogfontName(pOVar5,pwVar6);
        if (local_c0 == (ON_Font *)0x0) {
          pOVar5 = InstalledFontList();
          pwVar6 = ON_wString::operator_cast_to_wchar_t_(rich_text_font_name);
          local_c0 = ON_FontList::FromPostScriptName(pOVar5,pwVar6);
        }
        if (local_c0 == (ON_Font *)0x0) {
          pOVar5 = InstalledFontList();
          pwVar6 = ON_wString::operator_cast_to_wchar_t_(rich_text_font_name);
          ON_FontFaceQuartet::MemberToString((ON_FontFaceQuartet *)&stack0xffffffffffffff38,Regular)
          ;
          prefered_face_name =
               ON_wString::operator_cast_to_wchar_t_((ON_wString *)&stack0xffffffffffffff38);
          local_c0 = ON_FontList::FromFamilyName(pOVar5,pwVar6,prefered_face_name);
          ON_wString::~ON_wString((ON_wString *)&stack0xffffffffffffff38);
        }
        if (local_c0 != (ON_Font *)0x0) {
          InstalledFontQuartet((ON_FontFaceQuartet *)&installed_rtfface,local_c0);
          ON_FontFaceQuartet::operator=
                    ((ON_FontFaceQuartet *)&installed_font_1,
                     (ON_FontFaceQuartet *)&installed_rtfface);
          ON_FontFaceQuartet::~ON_FontFaceQuartet((ON_FontFaceQuartet *)&installed_rtfface);
          pOVar7 = ON_FontFaceQuartet::ClosestFace
                             ((ON_FontFaceQuartet *)&installed_font_1,(bool)(local_28[0xf] & 1),
                              (bool)(local_28[0xe] & 1));
          if (pOVar7 != (ON_Font *)0x0) {
            local_c0 = pOVar7;
          }
        }
      }
      if (local_c0 == (ON_Font *)0x0) {
        ON_wString::ON_wString(&en_quartet_name,rich_text_font_name);
        ON_wString::ON_wString(&loc_family_name,rich_text_font_name);
        ON_wString::ON_wString(&en_family_name,rich_text_font_name);
        ON_wString::ON_wString(&loc_windows_logfont_name,rich_text_font_name);
        ON_wString::ON_wString(&en_windows_logfont_name,rich_text_font_name);
        ON_wString::ON_wString((ON_wString *)&stack0xfffffffffffffed8,rich_text_font_name);
        normal_weight_font._7_1_ = Unset;
        normal_weight_font._6_1_ = Unset;
        bVar1 = ON_FontFaceQuartet::IsNotEmpty((ON_FontFaceQuartet *)&managed_quartet_face);
        if (bVar1) {
          bold_weight_font =
               ON_FontFaceQuartet::Face((ON_FontFaceQuartet *)&managed_quartet_face,Regular);
          if (bold_weight_font == (ON_Font *)0x0) {
            bold_weight_font =
                 ON_FontFaceQuartet::Face((ON_FontFaceQuartet *)&managed_quartet_face,Italic);
          }
          names_font = ON_FontFaceQuartet::Face((ON_FontFaceQuartet *)&managed_quartet_face,Bold);
          if (names_font == (ON_Font *)0x0) {
            names_font = ON_FontFaceQuartet::Face
                                   ((ON_FontFaceQuartet *)&managed_quartet_face,BoldItalic);
          }
          if (bold_weight_font == (ON_Font *)0x0) {
            local_3c8 = names_font;
          }
          else {
            local_3c8 = bold_weight_font;
          }
          local_150._8_8_ = local_3c8;
          if (local_3c8 != (ON_Font *)0x0) {
            QuartetName((ON_Font *)local_150,(NameLocale)local_3c8);
            QuartetName((ON_Font *)(local_160 + 8),(NameLocale)local_150._8_8_);
            Internal_SetFakeNamesFromExistingNames
                      ((ON_wString *)local_150,(ON_wString *)(local_160 + 8),&en_quartet_name,
                       &loc_family_name);
            ON_wString::~ON_wString((ON_wString *)(local_160 + 8));
            ON_wString::~ON_wString((ON_wString *)local_150);
            FamilyName((ON_Font *)local_160,(NameLocale)local_150._8_8_);
            FamilyName((ON_Font *)(local_170 + 8),(NameLocale)local_150._8_8_);
            Internal_SetFakeNamesFromExistingNames
                      ((ON_wString *)local_160,(ON_wString *)(local_170 + 8),&en_family_name,
                       &loc_windows_logfont_name);
            ON_wString::~ON_wString((ON_wString *)(local_170 + 8));
            ON_wString::~ON_wString((ON_wString *)local_160);
            WindowsLogfontName((ON_Font *)local_170,(NameLocale)local_150._8_8_);
            WindowsLogfontName((ON_Font *)&bold_unsigned,(NameLocale)local_150._8_8_);
            Internal_SetFakeNamesFromExistingNames
                      ((ON_wString *)local_170,(ON_wString *)&bold_unsigned,&en_windows_logfont_name
                       ,(ON_wString *)&stack0xfffffffffffffed8);
            ON_wString::~ON_wString((ON_wString *)&bold_unsigned);
            ON_wString::~ON_wString((ON_wString *)local_170);
          }
          if (bold_weight_font != (ON_Font *)0x0) {
            normal_weight_font._7_1_ = FontWeight(bold_weight_font);
          }
          if (names_font != (ON_Font *)0x0) {
            normal_weight_font._6_1_ = FontWeight(names_font);
          }
          uVar3 = (uint)normal_weight_font._7_1_;
          uVar4 = (uint)normal_weight_font._6_1_;
          if ((normal_weight_font._7_1_ != Unset) && (normal_weight_font._6_1_ == Unset)) {
            if (uVar3 < 7) {
              local_3cb = Bold;
            }
            else {
              if (uVar3 + 2 < 10) {
                local_3cd = FontWeightFromUnsigned(uVar3 + 2);
              }
              else {
                local_3cd = Heavy;
              }
              local_3cb = local_3cd;
            }
            normal_weight_font._6_1_ = local_3cb;
          }
          if ((normal_weight_font._6_1_ != Unset) && (normal_weight_font._7_1_ == Unset)) {
            if (uVar4 < 5) {
              if (uVar4 < 3) {
                local_3d0 = Thin;
              }
              else {
                local_3d0 = FontWeightFromUnsigned(uVar4 - 2);
              }
              local_3ce = local_3d0;
            }
            else {
              local_3ce = Normal;
            }
            normal_weight_font._7_1_ = local_3ce;
          }
        }
        if (normal_weight_font._7_1_ == Unset) {
          normal_weight_font._7_1_ = Normal;
        }
        if (normal_weight_font._6_1_ == Unset) {
          normal_weight_font._6_1_ = Bold;
        }
        bVar2 = LogfontCharSet(&Default);
        fake_font.m_managed_installed_font_and_bits._4_4_ = (uint)bVar2;
        ON_Font((ON_Font *)local_260);
        pwVar6 = ON_wString::operator_cast_to_wchar_t_(rich_text_font_name);
        if ((local_28[0xf] & 1) == 0) {
          local_3e1 = normal_weight_font._7_1_;
        }
        else {
          local_3e1 = normal_weight_font._6_1_;
        }
        SetFontCharacteristics
                  ((ON_Font *)local_260,0.0,pwVar6,local_3e1,(local_28[0xe] & 1) + Upright,Medium,
                   false,false,1.6,fake_font.m_managed_installed_font_and_bits._4_4_);
        ON_wString::operator=(&fake_font.m_en_postscript_name,&en_family_name);
        ON_wString::operator=(&fake_font.m_loc_family_name,&loc_windows_logfont_name);
        ON_wString::operator=(&fake_font.m_en_face_name,&en_windows_logfont_name);
        ON_wString::operator=
                  (&fake_font.m_loc_windows_logfont_name,(ON_wString *)&stack0xfffffffffffffed8);
        ON_FontFaceQuartet::MemberToString
                  ((ON_FontFaceQuartet *)&existing_managed_font,
                   installed_quartet.m_bold_italic._3_1_);
        ON_wString::operator=(&fake_font.m_en_family_name,(ON_wString *)&existing_managed_font);
        ON_wString::~ON_wString((ON_wString *)&existing_managed_font);
        ON_wString::operator=(&fake_font.m_loc_face_name,&fake_font.m_en_family_name);
        ON_wString::operator=(&fake_font.m_locale_name,&ON_wString::EmptyString);
        ON_wString::operator=(&fake_font.m_loc_postscript_name,&ON_wString::EmptyString);
        fake_font.m_apple_font_width_trait._1_1_ = installed_quartet.m_bold_italic._3_1_;
        local_270.m_s = (wchar_t *)GetManagedFont((ON_Font *)local_260,false);
        if ((ON_Font *)local_270.m_s != (ON_Font *)0x0) {
          QuartetName((ON_Font *)(local_280 + 8),(NameLocale)local_270.m_s);
          QuartetName((ON_Font *)local_280,(NameLocale)local_270.m_s);
          Internal_SetFakeNamesFromExistingNames
                    ((ON_wString *)(local_280 + 8),(ON_wString *)local_280,&en_quartet_name,
                     &loc_family_name);
          ON_wString::~ON_wString((ON_wString *)local_280);
          ON_wString::~ON_wString((ON_wString *)(local_280 + 8));
          FamilyName((ON_Font *)(local_290 + 8),(NameLocale)local_270.m_s);
          FamilyName((ON_Font *)local_290,(NameLocale)local_270.m_s);
          Internal_SetFakeNamesFromExistingNames
                    ((ON_wString *)(local_290 + 8),(ON_wString *)local_290,&en_family_name,
                     &loc_windows_logfont_name);
          ON_wString::~ON_wString((ON_wString *)local_290);
          ON_wString::~ON_wString((ON_wString *)(local_290 + 8));
          WindowsLogfontName((ON_Font *)(local_2a0 + 8),(NameLocale)local_270.m_s);
          WindowsLogfontName((ON_Font *)local_2a0,(NameLocale)local_270.m_s);
          Internal_SetFakeNamesFromExistingNames
                    ((ON_wString *)(local_2a0 + 8),(ON_wString *)local_2a0,&en_windows_logfont_name,
                     (ON_wString *)&stack0xfffffffffffffed8);
          ON_wString::~ON_wString((ON_wString *)local_2a0);
          ON_wString::~ON_wString((ON_wString *)(local_2a0 + 8));
          ON_wString::operator=(&fake_font.m_en_postscript_name,&en_family_name);
          ON_wString::operator=(&fake_font.m_loc_family_name,&loc_windows_logfont_name);
          ON_FontFaceQuartet::MemberToString
                    ((ON_FontFaceQuartet *)&managed_fake_font,installed_quartet.m_bold_italic._3_1_)
          ;
          ON_wString::operator=(&fake_font.m_en_family_name,(ON_wString *)&managed_fake_font);
          ON_wString::~ON_wString((ON_wString *)&managed_fake_font);
          ON_wString::operator=(&fake_font.m_loc_face_name,&fake_font.m_en_family_name);
          ON_wString::operator=(&fake_font.m_en_face_name,&en_windows_logfont_name);
          ON_wString::operator=
                    (&fake_font.m_loc_windows_logfont_name,(ON_wString *)&stack0xfffffffffffffed8);
        }
        installed_substitute = GetManagedFont((ON_Font *)local_260,true);
        if (installed_substitute == (ON_Font *)0x0) {
          rich_text_font_name_local =
               (ON_wString *)
               Internal_DecoratedFont(&Default,(bool)(local_28[0xd] & 1),(bool)(local_28[0xc] & 1));
        }
        else {
          bVar1 = IsInstalledFont(installed_substitute);
          if (bVar1) {
            rich_text_font_name_local =
                 (ON_wString *)
                 Internal_DecoratedFont
                           (installed_substitute,(bool)(local_28[0xd] & 1),(bool)(local_28[0xc] & 1)
                           );
          }
          else {
            local_2b8 = SubstituteFont(installed_substitute);
            if (((local_2b8 == (ON_Font *)0x0) || (bVar1 = IsInstalledFont(local_2b8), !bVar1)) ||
               (installed_quartet.m_bold_italic._3_1_ != local_2b8->m_quartet_member)) {
              InstalledFontQuartet((ON_FontFaceQuartet *)local_2e0,&Default);
              local_2b8 = ON_FontFaceQuartet::ClosestFace
                                    ((ON_FontFaceQuartet *)local_2e0,
                                     installed_quartet.m_bold_italic._3_1_);
              ON_FontFaceQuartet::~ON_FontFaceQuartet((ON_FontFaceQuartet *)local_2e0);
              if (local_2b8 == (ON_Font *)0x0) {
                local_2b8 = &Default;
              }
              Internal_SetManagedFontInstalledFont(installed_substitute,local_2b8,true);
            }
            rich_text_font_name_local =
                 (ON_wString *)
                 Internal_DecoratedFont
                           (installed_substitute,(bool)(local_28[0xd] & 1),(bool)(local_28[0xc] & 1)
                           );
          }
        }
        managed_substitute_quartet.m_bold_italic._4_4_ = 1;
        ~ON_Font((ON_Font *)local_260);
        ON_wString::~ON_wString((ON_wString *)&stack0xfffffffffffffed8);
        ON_wString::~ON_wString(&en_windows_logfont_name);
        ON_wString::~ON_wString(&loc_windows_logfont_name);
        ON_wString::~ON_wString(&en_family_name);
        ON_wString::~ON_wString(&loc_family_name);
        ON_wString::~ON_wString(&en_quartet_name);
      }
      else {
        rich_text_font_name_local =
             (ON_wString *)
             Internal_DecoratedFont(local_c0,(bool)(local_28[0xd] & 1),(bool)(local_28[0xc] & 1));
        managed_substitute_quartet.m_bold_italic._4_4_ = 1;
      }
      ON_MemoryAllocationTracking::~ON_MemoryAllocationTracking
                ((ON_MemoryAllocationTracking *)&local_str);
    }
    ON_FontFaceQuartet::~ON_FontFaceQuartet((ON_FontFaceQuartet *)&managed_quartet_face);
  }
  ON_FontFaceQuartet::~ON_FontFaceQuartet((ON_FontFaceQuartet *)&installed_font_1);
  return (ON_Font *)rich_text_font_name_local;
}

Assistant:

const ON_Font* ON_Font::FontFromRichTextProperties(
  ON_wString rich_text_font_name,
  bool bBoldQuartetMember,
  bool bItalicQuartetMember,
  bool bUnderlined,
  bool bStrikethrough
)
{
  rich_text_font_name.TrimLeftAndRight();
  if (rich_text_font_name.IsEmpty())
    rich_text_font_name = ON_Font::Default.RichTextFontName();

  const ON_FontFaceQuartet::Member rich_text_quartet_face = ON_FontFaceQuartet::MemberFromBoldAndItalic(bBoldQuartetMember, bItalicQuartetMember);

  ON_FontFaceQuartet installed_quartet = ON_ManagedFonts::InstalledFonts().QuartetFromQuartetName(rich_text_font_name);
  if ( installed_quartet.IsNotEmpty() )
  {
    // Installed font quartets use ClosestFace() because we know all the faces 
    // the real font contains.
    // If you don't get what you want, your asking for something that does not exist.
    // You may need to fix some user interface to not offer the choice that led you here.
    const ON_Font* installed_font = installed_quartet.ClosestFace(rich_text_quartet_face); // DO NOT CHANGE TO Face()
    if (nullptr != installed_font)
      return installed_font->Internal_DecoratedFont( bUnderlined, bStrikethrough);
  }

  const ON_FontFaceQuartet managed_substitute_quartet = ON_ManagedFonts::ManagedFonts().QuartetFromQuartetName(rich_text_font_name);
  if (managed_substitute_quartet.IsNotEmpty())
  {
    // Missing font quartets use Face() because we don't know what the real font quartet looks like.
    const ON_Font* managed_quartet_face = managed_substitute_quartet.Face(rich_text_quartet_face); // DO NOT CHANGE TO ClosestFace()
    if (nullptr != managed_quartet_face)
      return managed_quartet_face->Internal_DecoratedFont(bUnderlined, bStrikethrough); // this missing face has already been added to the quartet
  }

  // We will need to make a new managed font and put it in  a reasonable managed quartet.

  // All memory allocated for managed fonts is permanent app workspace memory.
  ON_MemoryAllocationTracking disable_tracking(false);
  {
    // convert the name to untracked memory so it doesn't look like a leak
    const ON_wString local_str(rich_text_font_name);
    rich_text_font_name = ON_wString::EmptyString;
    rich_text_font_name = ON_wString(static_cast<const wchar_t*>(local_str));
  }

  const ON_Font* installed_font = nullptr;
  installed_font = ON_Font::InstalledFontFromRichTextProperties(rich_text_font_name, bBoldQuartetMember, bItalicQuartetMember);
  if (nullptr == installed_font)
  {
#if defined(ON_RUNTIME_APPLE)
    if (nullptr == installed_font)
      installed_font = ON_Font::InstalledFontList().FromPostScriptName(rich_text_font_name);
#endif
    if (nullptr == installed_font)
      installed_font = ON_Font::InstalledFontList().FromWindowsLogfontName(rich_text_font_name);
#if !defined(ON_RUNTIME_APPLE)
    if (nullptr == installed_font)
      installed_font = ON_Font::InstalledFontList().FromPostScriptName(rich_text_font_name);
#endif
    if (nullptr == installed_font)
      installed_font = ON_Font::InstalledFontList().FromFamilyName(rich_text_font_name, ON_FontFaceQuartet::MemberToString(ON_FontFaceQuartet::Member::Regular) );
    if (nullptr != installed_font)
    {
      installed_quartet = installed_font->InstalledFontQuartet(); // only look at installed quartet!
      const ON_Font* installed_rtfface = installed_quartet.ClosestFace(bBoldQuartetMember, bItalicQuartetMember);
      if (nullptr != installed_rtfface)
        installed_font = installed_rtfface;
    }
  }

  if (nullptr != installed_font)
  {
    // The font is installed on this device.
    return installed_font->Internal_DecoratedFont(bUnderlined, bStrikethrough);
  }


  ON_wString loc_quartet_name = rich_text_font_name;
  ON_wString en_quartet_name = rich_text_font_name;

  ON_wString loc_family_name = rich_text_font_name;
  ON_wString en_family_name = rich_text_font_name;

  ON_wString loc_windows_logfont_name = rich_text_font_name;
  ON_wString en_windows_logfont_name = rich_text_font_name;

  ON_Font::Weight fake_normal_weight = ON_Font::Weight::Unset;
  ON_Font::Weight fake_bold_weight = ON_Font::Weight::Unset;

  if (managed_substitute_quartet.IsNotEmpty())
  {
    // get known names and guesses at weights from the existing parts of the quartet.

    const ON_Font* normal_weight_font = managed_substitute_quartet.Face(ON_FontFaceQuartet::Member::Regular);
    if ( nullptr == normal_weight_font)
      normal_weight_font = managed_substitute_quartet.Face(ON_FontFaceQuartet::Member::Italic);

    const ON_Font* bold_weight_font = managed_substitute_quartet.Face(ON_FontFaceQuartet::Member::Bold);
    if (nullptr == bold_weight_font)
      bold_weight_font = managed_substitute_quartet.Face(ON_FontFaceQuartet::Member::BoldItalic);

    const ON_Font* names_font = (nullptr != normal_weight_font) ? normal_weight_font : bold_weight_font;

    if (nullptr != names_font)
    {
      Internal_SetFakeNamesFromExistingNames(
        names_font->QuartetName(ON_Font::NameLocale::Localized),
        names_font->QuartetName(ON_Font::NameLocale::English),
        loc_quartet_name,
        en_quartet_name
      );

      Internal_SetFakeNamesFromExistingNames(
        names_font->FamilyName(ON_Font::NameLocale::Localized),
        names_font->FamilyName(ON_Font::NameLocale::English),
        loc_family_name,
        en_family_name
      );

      Internal_SetFakeNamesFromExistingNames(
        names_font->WindowsLogfontName(ON_Font::NameLocale::Localized),
        names_font->WindowsLogfontName(ON_Font::NameLocale::English),
        loc_windows_logfont_name,
        en_windows_logfont_name
      );
    }

    if (nullptr != normal_weight_font)
      fake_normal_weight = normal_weight_font->FontWeight();
    if (nullptr != bold_weight_font)
      fake_bold_weight = bold_weight_font->FontWeight();

    const unsigned normal_unsigned = static_cast<unsigned>(fake_normal_weight);
    const unsigned bold_unsigned = static_cast<unsigned>(fake_bold_weight);
    const unsigned default_normal_unsigned = static_cast<unsigned>(ON_Font::Weight::Normal);
    const unsigned default_bold_unsigned = static_cast<unsigned>(ON_Font::Weight::Bold);
    const unsigned min_weight = static_cast<unsigned>(ON_Font::Weight::Thin);
    const unsigned max_weight = static_cast<unsigned>(ON_Font::Weight::Heavy);

    if (ON_Font::Weight::Unset != fake_normal_weight && ON_Font::Weight::Unset == fake_bold_weight)
    {
      // have to guess at a bold weight
      fake_bold_weight
        = normal_unsigned < default_bold_unsigned
        ? ON_Font::Weight::Bold
        : ((normal_unsigned + 2 <= max_weight) ? ON_Font::FontWeightFromUnsigned(normal_unsigned + 2) : ON_Font::Weight::Heavy)
        ;
    }

    if (ON_Font::Weight::Unset != fake_bold_weight && ON_Font::Weight::Unset == fake_normal_weight)
    {
      // have to guess at a normal weight
      fake_normal_weight
        = bold_unsigned > default_normal_unsigned
        ? ON_Font::Weight::Normal
        : ((min_weight + 2 <= bold_unsigned) ? ON_Font::FontWeightFromUnsigned(bold_unsigned - 2) : ON_Font::Weight::Thin)
        ;
    }
  }

  if (ON_Font::Weight::Unset == fake_normal_weight)
    fake_normal_weight = ON_Font::Weight::Normal;
  if (ON_Font::Weight::Unset == fake_bold_weight)
    fake_bold_weight = ON_Font::Weight::Bold;

  const double point_size = 0.0;
  const unsigned int logfont_charset = ON_Font::Default.LogfontCharSet();

  ON_Font fake_font;
  fake_font.SetFontCharacteristics(
    point_size,
    rich_text_font_name,
    bBoldQuartetMember ? fake_bold_weight : fake_normal_weight,
    bItalicQuartetMember ? ON_Font::Style::Italic : ON_Font::Style::Upright,
    ON_Font::Stretch::Medium,
    false, // DO NOT PASS bUnderlined here
    false, // DO NOT PASS bStrikethrough here
    ON_FontMetrics::DefaultLineFeedRatio,
    logfont_charset
  );

  fake_font.m_loc_family_name = loc_family_name;
  fake_font.m_en_family_name = en_family_name;

  fake_font.m_loc_windows_logfont_name = loc_windows_logfont_name;
  fake_font.m_en_windows_logfont_name = en_windows_logfont_name;

  // There is no reliable way to get the face name  - we fake it by using the quartet face name below
  fake_font.m_loc_face_name = ON_FontFaceQuartet::MemberToString(rich_text_quartet_face);
  fake_font.m_en_face_name = fake_font.m_loc_face_name;

  // There is no reliable way to get the PostScript name 
  fake_font.m_loc_postscript_name = ON_wString::EmptyString;
  fake_font.m_en_postscript_name = ON_wString::EmptyString;

  fake_font.m_quartet_member = rich_text_quartet_face;

  // When reading 3dm files created on a device with other fonts
  // Frequently a managed font is added when a dimstyle is read.
  // Later on annotation objects are read and rich text requests
  // regular/bold/italic/bold-italic faces from the dimstyle font's 
  // quartet. When existing_managed_font is not nullptr, we need
  // to create a fake quartet containing that font.
  // When existing_managed_font is nullptr, we need to create
  // a fake quartet based on only the rtf_font_name.
  // (Sure wish we had not dumped the V5 font table, sigh.)
  const ON_Font* existing_managed_font = ON_Font::GetManagedFont(fake_font, false);

  if (nullptr != existing_managed_font)
  {
    Internal_SetFakeNamesFromExistingNames(
      existing_managed_font->QuartetName(ON_Font::NameLocale::Localized),
      existing_managed_font->QuartetName(ON_Font::NameLocale::English),
      loc_quartet_name,
      en_quartet_name
    );

    Internal_SetFakeNamesFromExistingNames(
      existing_managed_font->FamilyName(ON_Font::NameLocale::Localized),
      existing_managed_font->FamilyName(ON_Font::NameLocale::English),
      loc_family_name,
      en_family_name
    );

    Internal_SetFakeNamesFromExistingNames(
      existing_managed_font->WindowsLogfontName(ON_Font::NameLocale::Localized),
      existing_managed_font->WindowsLogfontName(ON_Font::NameLocale::English),
      loc_windows_logfont_name,
      en_windows_logfont_name
    );

    fake_font.m_loc_family_name = loc_family_name;
    fake_font.m_en_family_name = en_family_name;

    fake_font.m_loc_face_name = ON_FontFaceQuartet::MemberToString(rich_text_quartet_face);
    fake_font.m_en_face_name = fake_font.m_loc_face_name;

    fake_font.m_loc_windows_logfont_name = loc_windows_logfont_name;
    fake_font.m_en_windows_logfont_name = en_windows_logfont_name;
  }

  // Need to make a fake rich text quartet of managed fonts so rich text 
  // bold and italic faces work as expected.

  // creating a managed fake font resets the fake quartets
  // and this fake will get added to the quartets next time
  // they are needed.
  const ON_Font* managed_fake_font = ON_Font::GetManagedFont(fake_font, true);

  if (nullptr == managed_fake_font)
  {
    // should never happen
    return ON_Font::Default.Internal_DecoratedFont(bUnderlined, bStrikethrough);
  }

  if (managed_fake_font->IsInstalledFont())
  {
    return managed_fake_font->Internal_DecoratedFont(bUnderlined, bStrikethrough);
  }

  // set installed substitute used to render the missing font
  const ON_Font* installed_substitute = managed_fake_font->SubstituteFont();
  if (nullptr == installed_substitute || false == installed_substitute->IsInstalledFont() || rich_text_quartet_face != installed_substitute->m_quartet_member)
  {
    // We have better information to select the correct substitute than inside the ON_Font::GetManagedFont(fake_font, true) call above.
    // Use this information to specify a better substitute font.
    installed_substitute = ON_Font::Default.InstalledFontQuartet().ClosestFace(rich_text_quartet_face); // only look at installed quartet
    if (nullptr == installed_substitute)
      installed_substitute = &ON_Font::Default;
    const bool bInstalledFontIsASubstitute = true;
    ON_Font::Internal_SetManagedFontInstalledFont(
      managed_fake_font,
      installed_substitute,
      bInstalledFontIsASubstitute
    );
  }

  return managed_fake_font->Internal_DecoratedFont(bUnderlined, bStrikethrough);
}